

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O2

aom_codec_err_t
aom_film_grain_table_read
          (aom_film_grain_table_t *t,char *filename,aom_internal_error_info *error_info)

{
  uint uVar1;
  aom_film_grain_table_entry_t *paVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  size_t sVar5;
  aom_film_grain_table_entry_t *__s;
  char *pcVar6;
  int (*paiVar7) [2];
  int *piVar8;
  aom_film_grain_table_entry_t *paVar9;
  long lVar10;
  ulong uVar11;
  aom_codec_err_t error;
  char magic [9];
  
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to open %s",filename);
  }
  else {
    error_info->error_code = AOM_CODEC_OK;
    sVar5 = fread(magic,9,1,__stream);
    if ((sVar5 != 0) && (magic._0_8_ == 0x316e72676d6c6966)) {
      paVar9 = (aom_film_grain_table_entry_t *)0x0;
LAB_00254ee8:
      iVar3 = feof(__stream);
      if (iVar3 == 0) {
        __s = (aom_film_grain_table_entry_t *)aom_malloc(0x2a0);
        if (__s != (aom_film_grain_table_entry_t *)0x0) {
          memset(__s,0,0x2a0);
          piVar8 = &(__s->params).update_parameters;
          uVar4 = __isoc99_fscanf(__stream,"E %ld %ld %d %hd %d\n",&__s->start_time,&__s->end_time,
                                  __s,&(__s->params).random_seed,piVar8);
          if (uVar4 == 5) {
            if (*piVar8 == 0) goto LAB_00255259;
            uVar4 = __isoc99_fscanf(__stream,"p %d %d %d %d %d %d %d %d %d %d %d %d\n",
                                    &(__s->params).ar_coeff_lag,&(__s->params).ar_coeff_shift,
                                    &(__s->params).grain_scale_shift,&(__s->params).scaling_shift,
                                    &(__s->params).chroma_scaling_from_luma,
                                    &(__s->params).overlap_flag,&(__s->params).cb_mult,
                                    &(__s->params).cb_luma_mult,&(__s->params).cb_offset,
                                    &(__s->params).cr_mult,&(__s->params).cr_luma_mult,
                                    &(__s->params).cr_offset);
            if (uVar4 != 0xc) {
              aom_internal_error(error_info,AOM_CODEC_ERROR,
                                 "Unable to read entry params. Read %d != 12",(ulong)uVar4);
              goto LAB_00255259;
            }
            piVar8 = &(__s->params).num_y_points;
            iVar3 = __isoc99_fscanf(__stream,"\tsY %d ",piVar8);
            if (iVar3 == 0) {
              pcVar6 = "Unable to read num y points";
            }
            else {
              lVar10 = -1;
              paVar2 = __s;
              do {
                paiVar7 = (paVar2->params).scaling_points_y;
                lVar10 = lVar10 + 1;
                if (*piVar8 <= lVar10) {
                  piVar8 = &(__s->params).num_cb_points;
                  iVar3 = __isoc99_fscanf(__stream,"\n\tsCb %d",piVar8);
                  if (iVar3 == 0) {
                    pcVar6 = "Unable to read num cb points";
                    goto LAB_0025524e;
                  }
                  lVar10 = -1;
                  paiVar7 = (__s->params).scaling_points_cb;
                  goto LAB_002550e3;
                }
                iVar3 = __isoc99_fscanf(__stream,"%d %d",paiVar7,
                                        (paVar2->params).scaling_points_y[0] + 1);
                paVar2 = (aom_film_grain_table_entry_t *)paiVar7;
              } while (iVar3 == 2);
              pcVar6 = "Unable to read y scaling points";
            }
            goto LAB_0025524e;
          }
          if ((uVar4 != 0) || (iVar3 = feof(__stream), iVar3 == 0)) {
            aom_internal_error(error_info,AOM_CODEC_ERROR,
                               "Unable to read entry header. Read %d != 5",(ulong)uVar4);
          }
          goto LAB_00255259;
        }
        pcVar6 = "Unable to allocate grain table entry";
        error = AOM_CODEC_MEM_ERROR;
        goto LAB_00254e9d;
      }
      goto LAB_00254ea8;
    }
    pcVar6 = "Unable to read (or invalid) file magic";
    error = AOM_CODEC_ERROR;
LAB_00254e9d:
    aom_internal_error(error_info,error,pcVar6);
LAB_00254ea8:
    fclose(__stream);
  }
  return error_info->error_code;
  while( true ) {
    iVar3 = __isoc99_fscanf(__stream,"%d %d",paiVar7,*paiVar7 + 1);
    paiVar7 = paiVar7 + 1;
    if (iVar3 != 2) break;
LAB_002550e3:
    lVar10 = lVar10 + 1;
    if (*piVar8 <= lVar10) {
      piVar8 = &(__s->params).num_cr_points;
      iVar3 = __isoc99_fscanf(__stream,"\n\tsCr %d",piVar8);
      if (iVar3 == 0) {
        pcVar6 = "Unable to read num cr points";
        goto LAB_0025524e;
      }
      lVar10 = -1;
      paiVar7 = (__s->params).scaling_points_cr;
      goto LAB_0025515e;
    }
  }
  pcVar6 = "Unable to read cb scaling points";
  goto LAB_0025524e;
  while( true ) {
    iVar3 = __isoc99_fscanf(__stream,"%d %d",paiVar7,*paiVar7 + 1);
    paiVar7 = paiVar7 + 1;
    if (iVar3 != 2) break;
LAB_0025515e:
    lVar10 = lVar10 + 1;
    if (*piVar8 <= lVar10) {
      iVar3 = __isoc99_fscanf(__stream,"\n\tcY");
      if (iVar3 != 0) {
        pcVar6 = "Unable to read Y coeffs header (cY)";
        goto LAB_0025524e;
      }
      iVar3 = (__s->params).ar_coeff_lag;
      uVar4 = (iVar3 + 1) * iVar3 * 2;
      uVar11 = 0;
      if (0 < (int)uVar4) {
        uVar11 = (ulong)uVar4;
      }
      lVar10 = uVar11 + 1;
      piVar8 = (__s->params).ar_coeffs_y;
      goto LAB_002551fb;
    }
  }
  pcVar6 = "Unable to read cr scaling points";
  goto LAB_0025524e;
  while( true ) {
    iVar3 = __isoc99_fscanf(__stream,"%d",piVar8);
    piVar8 = piVar8 + 1;
    if (iVar3 != 1) break;
LAB_002551fb:
    lVar10 = lVar10 + -1;
    if (lVar10 == 0) {
      iVar3 = __isoc99_fscanf(__stream,"\n\tcCb",piVar8);
      if (iVar3 != 0) {
        pcVar6 = "Unable to read Cb coeffs header (cCb)";
        goto LAB_0025524e;
      }
      uVar1 = uVar4 | 1;
      if ((int)(uVar4 | 1) < 1) {
        uVar1 = 0;
      }
      uVar11 = ~(ulong)uVar1;
      piVar8 = (__s->params).ar_coeffs_cb;
      goto LAB_002552b0;
    }
  }
  pcVar6 = "Unable to read Y coeffs";
  goto LAB_0025524e;
  while( true ) {
    iVar3 = __isoc99_fscanf(__stream,"%d",piVar8);
    piVar8 = piVar8 + 1;
    if (iVar3 != 1) break;
LAB_002552b0:
    uVar11 = uVar11 + 1;
    if (uVar11 == 0) {
      iVar3 = __isoc99_fscanf(__stream,"\n\tcCr",piVar8);
      if (iVar3 != 0) {
        pcVar6 = "Unable read to Cr coeffs header (cCr)";
        goto LAB_00255307;
      }
      uVar1 = uVar4 + 1;
      if ((int)(uVar4 + 1) < 1) {
        uVar1 = 0;
      }
      uVar11 = ~(ulong)uVar1;
      piVar8 = (__s->params).ar_coeffs_cr;
      goto LAB_0025532f;
    }
  }
  pcVar6 = "Unable to read Cb coeffs";
LAB_00255307:
  aom_internal_error(error_info,AOM_CODEC_ERROR,pcVar6);
  goto LAB_00255259;
  while( true ) {
    iVar3 = __isoc99_fscanf(__stream,"%d",piVar8);
    piVar8 = piVar8 + 1;
    if (iVar3 != 1) break;
LAB_0025532f:
    uVar11 = uVar11 + 1;
    if (uVar11 == 0) {
      __isoc99_fscanf(__stream,"\n",piVar8);
      goto LAB_00255259;
    }
  }
  pcVar6 = "Unable to read Cr coeffs";
LAB_0025524e:
  aom_internal_error(error_info,AOM_CODEC_ERROR,pcVar6);
LAB_00255259:
  __s->next = (aom_film_grain_table_entry_t *)0x0;
  if (paVar9 != (aom_film_grain_table_entry_t *)0x0) {
    paVar9->next = __s;
  }
  if (t->head == (aom_film_grain_table_entry_t *)0x0) {
    t->head = __s;
  }
  t->tail = __s;
  paVar9 = __s;
  if (error_info->error_code != AOM_CODEC_OK) goto LAB_00254ea8;
  goto LAB_00254ee8;
}

Assistant:

aom_codec_err_t aom_film_grain_table_read(
    aom_film_grain_table_t *t, const char *filename,
    struct aom_internal_error_info *error_info) {
  FILE *file = fopen(filename, "rb");
  if (!file) {
    aom_internal_error(error_info, AOM_CODEC_ERROR, "Unable to open %s",
                       filename);
    return error_info->error_code;
  }
  error_info->error_code = AOM_CODEC_OK;

  // Read in one extra character as there should be white space after
  // the header.
  char magic[9];
  if (!fread(magic, 9, 1, file) || memcmp(magic, kFileMagic, 8)) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to read (or invalid) file magic");
    fclose(file);
    return error_info->error_code;
  }

  aom_film_grain_table_entry_t *prev_entry = NULL;
  while (!feof(file)) {
    aom_film_grain_table_entry_t *entry = aom_malloc(sizeof(*entry));
    if (!entry) {
      aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                         "Unable to allocate grain table entry");
      break;
    }
    memset(entry, 0, sizeof(*entry));
    grain_table_entry_read(file, error_info, entry);
    entry->next = NULL;

    if (prev_entry) prev_entry->next = entry;
    if (!t->head) t->head = entry;
    t->tail = entry;
    prev_entry = entry;

    if (error_info->error_code != AOM_CODEC_OK) break;
  }

  fclose(file);
  return error_info->error_code;
}